

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rtreeStepToLeaf(RtreeCursor *pCur)

{
  char cVar1;
  undefined4 uVar2;
  RtreeConstraint *pRVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  ushort uVar7;
  uint uVar8;
  float fVar9;
  int iVar10;
  long lVar11;
  i64 iVar12;
  ulong uVar13;
  RtreeSearchPoint *pRVar14;
  byte bVar15;
  byte bVar16;
  long lVar17;
  int iVar18;
  u8 *puVar19;
  u8 uVar20;
  double dVar21;
  RtreeDValue RVar22;
  double dVar23;
  double dVar24;
  int local_d8;
  uint local_d4;
  double local_d0;
  int local_c4;
  u8 *local_c0;
  RtreeCursor *local_b8;
  RtreeSearchPoint *local_b0;
  RtreeNode *local_a8;
  long local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  RtreeSearchPoint *local_48;
  sqlite3_vtab *local_40;
  u8 *local_38;
  
  local_40 = (pCur->base).pVtab;
  local_d8 = 0;
  local_a0 = (long)pCur->nConstraint;
  cVar1 = local_40[1].field_0xe;
  local_48 = &pCur->sPoint;
  local_b8 = pCur;
  while ((local_b0 = local_48, pCur->bPoint != '\0' ||
         ((uVar20 = '\x01', pCur->nPoint != 0 &&
          (local_b0 = pCur->aPoint, local_b0 != (RtreeSearchPoint *)0x0))))) {
    if (local_b0->iLevel == '\0') {
      uVar20 = '\0';
      break;
    }
    local_a8 = rtreeNodeOfFirstSearchPoint(pCur,&local_d8);
    if (local_d8 != 0) {
      return local_d8;
    }
    uVar7 = *(ushort *)(local_a8->zData + 2) << 8 | *(ushort *)(local_a8->zData + 2) >> 8;
    bVar15 = local_b0->iCell;
    pRVar14 = local_b0;
    uVar8 = (uint)uVar7;
    uVar6 = (uint)uVar7;
    if ((uint)bVar15 < (uint)uVar7) {
      do {
        local_d4 = uVar6;
        lVar11 = (ulong)bVar15 * (ulong)(byte)local_40[1].field_0xf;
        local_c0 = local_a8->zData + lVar11 + 4;
        if ((int)local_a0 < 1) {
          bVar16 = bVar15 + 1;
          pRVar14->iCell = bVar16;
          iVar18 = 2;
          dVar24 = -1.0;
LAB_001e0b42:
          uVar8 = local_d4;
          local_d8 = 0;
          uVar20 = pRVar14->iLevel + 0xff;
          local_d0 = dVar24;
          if (uVar20 == '\0') {
            iVar12 = pRVar14->id;
          }
          else {
            iVar12 = readInt64(local_c0);
            bVar15 = 0;
          }
          if (uVar8 <= bVar16) {
            rtreeSearchPointPop(pCur);
          }
          RVar22 = 0.0;
          if (0.0 <= local_d0) {
            RVar22 = local_d0;
          }
          pRVar14 = rtreeSearchPointNew(pCur,RVar22,uVar20);
          if (pRVar14 == (RtreeSearchPoint *)0x0) {
            return 7;
          }
          pRVar14->eWithin = (u8)iVar18;
          pRVar14->id = iVar12;
          pRVar14->iCell = bVar15;
          goto LAB_001e0b0c;
        }
        puVar19 = local_a8->zData + lVar11;
        iVar18 = 2;
        lVar17 = 0x10;
        dVar24 = -1.0;
        lVar11 = 1;
        local_38 = puVar19;
        do {
          pRVar3 = pCur->aConstraint;
          iVar10 = *(int *)((long)pRVar3 + lVar17 + -0xc);
          if (0x45 < iVar10) {
            lVar4 = *(long *)((long)&pRVar3->iCoord + lVar17);
            uVar2 = *(undefined4 *)(lVar4 + 0x38);
            if ((iVar10 == 0x47) && (pRVar14->iLevel == '\x01')) {
              local_d0 = dVar24;
              iVar12 = readInt64(local_c0);
              *(i64 *)(lVar4 + 0x48) = iVar12;
              pRVar14 = local_b0;
              puVar19 = local_38;
              dVar24 = local_d0;
            }
            if (cVar1 == '\x01') {
              switch(uVar2) {
              case 10:
                uVar8 = *(uint *)(puVar19 + 0x30);
                local_50 = (double)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                         (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
                uVar8 = *(uint *)(puVar19 + 0x2c);
                local_58 = (double)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                         (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
              case 8:
                uVar8 = *(uint *)(puVar19 + 0x28);
                local_60 = (double)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                         (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
                uVar8 = *(uint *)(puVar19 + 0x24);
                local_68 = (double)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                         (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
              case 6:
                uVar8 = *(uint *)(puVar19 + 0x20);
                local_70 = (double)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                         (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
                uVar8 = *(uint *)(puVar19 + 0x1c);
                local_78 = (double)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                         (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
              case 4:
                uVar8 = *(uint *)(puVar19 + 0x18);
                local_80 = (double)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                         (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
                uVar8 = *(uint *)(puVar19 + 0x14);
                local_88 = (double)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                         (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
              default:
                uVar8 = *(uint *)(puVar19 + 0x10);
                local_90 = (double)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                         (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
                uVar8 = *(uint *)(puVar19 + 0xc);
                local_98 = (double)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                         (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
              }
            }
            else {
              switch(uVar2) {
              case 10:
                uVar8 = *(uint *)(puVar19 + 0x30);
                local_50 = (double)(float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                           (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
                uVar8 = *(uint *)(puVar19 + 0x2c);
                local_58 = (double)(float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                           (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
              case 8:
                uVar8 = *(uint *)(puVar19 + 0x28);
                local_60 = (double)(float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                           (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
                uVar8 = *(uint *)(puVar19 + 0x24);
                local_68 = (double)(float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                           (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
              case 6:
                uVar8 = *(uint *)(puVar19 + 0x20);
                local_70 = (double)(float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                           (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
                uVar8 = *(uint *)(puVar19 + 0x1c);
                local_78 = (double)(float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                           (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
              case 4:
                uVar8 = *(uint *)(puVar19 + 0x18);
                local_80 = (double)(float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                           (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
                uVar8 = *(uint *)(puVar19 + 0x14);
                local_88 = (double)(float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                           (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
              default:
                uVar8 = *(uint *)(puVar19 + 0x10);
                local_90 = (double)(float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                           (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
                uVar8 = *(uint *)(puVar19 + 0xc);
                local_98 = (double)(float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                           (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
              }
            }
            if (iVar10 == 0x46) {
              local_c4 = 0;
              iVar10 = (**(code **)((long)pRVar3 + lVar17 + -8))(lVar4,uVar2,&local_98,&local_c4);
              if (local_c4 == 0) {
                iVar18 = 0;
              }
              dVar24 = 0.0;
            }
            else {
              *(double **)(lVar4 + 0x28) = &local_98;
              *(uint *)(lVar4 + 0x3c) = pRVar14->iLevel - 1;
              RVar22 = pRVar14->rScore;
              *(RtreeDValue *)(lVar4 + 0x50) = RVar22;
              *(RtreeDValue *)(lVar4 + 0x60) = RVar22;
              bVar15 = pRVar14->eWithin;
              *(uint *)(lVar4 + 0x58) = (uint)bVar15;
              *(uint *)(lVar4 + 0x5c) = (uint)bVar15;
              local_d0 = dVar24;
              iVar10 = (**(code **)((long)pRVar3 + lVar17 + -8))(lVar4);
              if (*(int *)(lVar4 + 0x5c) < iVar18) {
                iVar18 = *(int *)(lVar4 + 0x5c);
              }
              dVar24 = *(double *)(lVar4 + 0x60);
              if ((0.0 <= local_d0) && (local_d0 <= dVar24)) {
                dVar24 = local_d0;
              }
            }
            pRVar14 = local_b0;
            pCur = local_b8;
            if (iVar10 != 0) {
              return iVar10;
            }
            goto LAB_001e0aa3;
          }
          uVar8 = *(int *)((long)pRVar3 + lVar17 + -0x10) << 2;
          if (pRVar14->iLevel == '\x01') {
            uVar8 = *(uint *)(puVar19 + (long)(int)uVar8 + 0xc);
            fVar9 = (float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                           uVar8 << 0x18);
            if (cVar1 == '\x01') {
              dVar21 = (double)(int)fVar9;
            }
            else {
              dVar21 = (double)fVar9;
            }
            dVar23 = *(double *)((long)pRVar3 + lVar17 + -8);
            switch(iVar10) {
            case 0x42:
              goto switchD_001e0a4a_caseD_42;
            case 0x43:
              if (dVar21 < dVar23) break;
              goto LAB_001e0ad7;
            case 0x44:
              if (dVar21 < dVar23) goto LAB_001e0ad7;
              break;
            case 0x45:
              if (dVar21 <= dVar23) goto LAB_001e0ad7;
              break;
            default:
              if ((dVar21 != dVar23) || (NAN(dVar21) || NAN(dVar23))) goto LAB_001e0ad7;
            }
          }
          else {
            uVar13 = (ulong)(uVar8 & 0x3f8);
            if (iVar10 - 0x41U < 3) {
              uVar8 = *(uint *)(local_c0 + uVar13 + 8);
              fVar9 = (float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                             uVar8 << 0x18);
              if (cVar1 == '\x01') {
                dVar23 = (double)(int)fVar9;
              }
              else {
                dVar23 = (double)fVar9;
              }
              dVar21 = *(double *)((long)pRVar3 + lVar17 + -8);
              if (dVar23 <= dVar21) goto LAB_001e0aa3;
              if (iVar10 != 0x41) goto LAB_001e0ad7;
            }
            else {
              dVar21 = *(double *)((long)pRVar3 + lVar17 + -8);
            }
            uVar8 = *(uint *)(local_c0 + uVar13 + 0xc);
            fVar9 = (float)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                           uVar8 << 0x18);
            if (cVar1 == '\x01') {
              dVar23 = (double)(int)fVar9;
            }
            else {
              dVar23 = (double)fVar9;
            }
switchD_001e0a4a_caseD_42:
            if (dVar23 < dVar21) {
LAB_001e0ad7:
              bVar16 = pRVar14->iCell + 1;
              pRVar14->iCell = bVar16;
              goto LAB_001e0af8;
            }
          }
LAB_001e0aa3:
          if (iVar18 == 0) break;
          lVar17 = lVar17 + 0x18;
          bVar5 = lVar11 < local_a0;
          lVar11 = lVar11 + 1;
        } while (bVar5);
        bVar15 = pRVar14->iCell;
        bVar16 = bVar15 + 1;
        pRVar14->iCell = bVar16;
        if (iVar18 != 0) goto LAB_001e0b42;
LAB_001e0af8:
        bVar15 = bVar16;
        uVar8 = local_d4;
        uVar6 = local_d4;
      } while (bVar15 < local_d4);
    }
    local_d8 = 0;
LAB_001e0b0c:
    if (uVar8 <= bVar15) {
      rtreeSearchPointPop(pCur);
    }
  }
  pCur->atEOF = uVar20;
  return 0;
}

Assistant:

static int rtreeStepToLeaf(RtreeCursor *pCur){
  RtreeSearchPoint *p;
  Rtree *pRtree = RTREE_OF_CURSOR(pCur);
  RtreeNode *pNode;
  int eWithin;
  int rc = SQLITE_OK;
  int nCell;
  int nConstraint = pCur->nConstraint;
  int ii;
  int eInt;
  RtreeSearchPoint x;

  eInt = pRtree->eCoordType==RTREE_COORD_INT32;
  while( (p = rtreeSearchPointFirst(pCur))!=0 && p->iLevel>0 ){
    pNode = rtreeNodeOfFirstSearchPoint(pCur, &rc);
    if( rc ) return rc;
    nCell = NCELL(pNode);
    assert( nCell<200 );
    while( p->iCell<nCell ){
      sqlite3_rtree_dbl rScore = (sqlite3_rtree_dbl)-1;
      u8 *pCellData = pNode->zData + (4+pRtree->nBytesPerCell*p->iCell);
      eWithin = FULLY_WITHIN;
      for(ii=0; ii<nConstraint; ii++){
        RtreeConstraint *pConstraint = pCur->aConstraint + ii;
        if( pConstraint->op>=RTREE_MATCH ){
          rc = rtreeCallbackConstraint(pConstraint, eInt, pCellData, p,
                                       &rScore, &eWithin);
          if( rc ) return rc;
        }else if( p->iLevel==1 ){
          rtreeLeafConstraint(pConstraint, eInt, pCellData, &eWithin);
        }else{
          rtreeNonleafConstraint(pConstraint, eInt, pCellData, &eWithin);
        }
        if( eWithin==NOT_WITHIN ) break;
      }
      p->iCell++;
      if( eWithin==NOT_WITHIN ) continue;
      x.iLevel = p->iLevel - 1;
      if( x.iLevel ){
        x.id = readInt64(pCellData);
        x.iCell = 0;
      }else{
        x.id = p->id;
        x.iCell = p->iCell - 1;
      }
      if( p->iCell>=nCell ){
        RTREE_QUEUE_TRACE(pCur, "POP-S:");
        rtreeSearchPointPop(pCur);
      }
      if( rScore<RTREE_ZERO ) rScore = RTREE_ZERO;
      p = rtreeSearchPointNew(pCur, rScore, x.iLevel);
      if( p==0 ) return SQLITE_NOMEM;
      p->eWithin = (u8)eWithin;
      p->id = x.id;
      p->iCell = x.iCell;
      RTREE_QUEUE_TRACE(pCur, "PUSH-S:");
      break;
    }
    if( p->iCell>=nCell ){
      RTREE_QUEUE_TRACE(pCur, "POP-Se:");
      rtreeSearchPointPop(pCur);
    }
  }
  pCur->atEOF = p==0;
  return SQLITE_OK;
}